

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression_test.cpp
# Opt level: O2

vector<long_long,_std::allocator<long_long>_> *
populateVector(vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,int n)

{
  int iVar1;
  long in_RAX;
  int iVar2;
  bool bVar3;
  long local_28;
  
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = 0;
  if (0 < n) {
    iVar2 = n;
  }
  local_28 = in_RAX;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    iVar1 = rand();
    local_28 = (long)(iVar1 + -0x3fffffff);
    std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
              (__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ll> populateVector(int n) {
    vector<ll> v;
    rep(i,0,n) {
        v.push_back(rand() - RAND_MAX/2);
    }
    return v;
}